

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::import_line
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  int iVar1;
  pointer pbVar2;
  char *pcVar3;
  bool bVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  undefined8 uVar9;
  int local_4c;
  pair<const_int,_GEO::line> local_48;
  long local_38;
  
  pbVar2 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = is_integer(pbVar2 + 1);
  if (!bVar4) {
LAB_0012c8f8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*line_number);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," of ",4);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    return 1;
  }
  bVar4 = is_integer(pbVar2 + 2);
  if ((!bVar4) || (bVar4 = is_integer(pbVar2 + 3), !bVar4)) goto LAB_0012c8f8;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(pcVar3,(char **)&local_48,10);
  if ((char *)CONCAT44(local_48.second.start,local_48.first) == pcVar3) {
    std::__throw_invalid_argument("stoi");
LAB_0012c9a3:
    std::__throw_out_of_range("stoi");
LAB_0012c9af:
    std::__throw_invalid_argument("stoi");
LAB_0012c9bb:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_0012c9a3;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    pcVar3 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    local_4c = *piVar5;
    *piVar5 = 0;
    local_38 = lVar6;
    lVar6 = strtol(pcVar3,(char **)&local_48,10);
    if ((char *)CONCAT44(local_48.second.start,local_48.first) == pcVar3) goto LAB_0012c9af;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0012c9bb;
    if (*piVar5 == 0) {
      *piVar5 = local_4c;
    }
    pcVar3 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    local_4c = *piVar5;
    *piVar5 = 0;
    lVar7 = strtol(pcVar3,(char **)&local_48,10);
    if ((char *)CONCAT44(local_48.second.start,local_48.first) != pcVar3) {
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = local_4c;
        }
        local_48.first = (int)lVar7;
        local_48.second.start = (int)local_38;
        local_48.second.end = (int)lVar6;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
                    *)&this->lines_map,&local_48);
        return 0;
      }
      goto LAB_0012c9d3;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0012c9d3:
  uVar9 = std::__throw_out_of_range("stoi");
  if (*piVar5 == 0) {
    *piVar5 = local_4c;
  }
  _Unwind_Resume(uVar9);
}

Assistant:

int GEO::geofile::import_line( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ((is_integer(split_string_vector[1])==true)&&
        (is_integer(split_string_vector[2])==true)&&
        (is_integer(split_string_vector[3])==true))
    {
        line input_line;
        auto start = std::stoi(split_string_vector[2]);
        auto end   = std::stoi(split_string_vector[3]);
        input_line.start = start;
        input_line.end = end;
        lines_map.insert({std::stoi(split_string_vector[1]), input_line});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}